

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *next_segment;
  char *segment;
  char *data_local;
  ostream *stream_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator<<(stream,"<![CDATA[");
  next_segment = data;
  while( true ) {
    pcVar2 = strstr(next_segment,"]]>");
    if (pcVar2 == (char *)0x0) break;
    std::ostream::write((char *)stream,(long)next_segment);
    std::operator<<(stream,"]]>]]&gt;<![CDATA[");
    next_segment = pcVar2 + 3;
  }
  std::operator<<(stream,next_segment);
  std::operator<<(stream,"]]>");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != NULL) {
      stream->write(
          segment, static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}